

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_ModelTest::DumpReadWriteReadModel(ONX_ModelTest *this,wchar_t *text_file_full_path)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  ON_ComponentManifest *this_01;
  undefined1 local_c8 [8];
  ON_TextLog text_log;
  undefined1 local_38 [8];
  shared_ptr<ONX_Model> model;
  FILE *fp;
  bool rc;
  wchar_t *text_file_full_path_local;
  ONX_ModelTest *this_local;
  
  fp._7_1_ = false;
  model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((text_file_full_path != (wchar_t *)0x0) && (*text_file_full_path != L'\0')) &&
     (model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ON_FileStream::Open(text_file_full_path,L"w"),
     (FILE *)model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
     (FILE *)0x0)) {
    ReadWriteReadModel((ONX_ModelTest *)local_38);
    bVar1 = std::operator==((nullptr_t)0x0,(shared_ptr<ONX_Model> *)local_38);
    if (!bVar1) {
      this_00 = std::__shared_ptr_access<ONX_Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ONX_Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
      this_01 = ONX_Model::Manifest(this_00);
      uVar2 = ON_ComponentManifest::ActiveComponentCount(this_01,Unset);
      if (uVar2 != 0) {
        ON_TextLog::ON_TextLog
                  ((ON_TextLog *)local_c8,
                   (FILE *)model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
        fp._7_1_ = DumpReadWriteReadModel(this,(ON_TextLog *)local_c8);
        ON_TextLog::~ON_TextLog((ON_TextLog *)local_c8);
      }
    }
    std::shared_ptr<ONX_Model>::~shared_ptr((shared_ptr<ONX_Model> *)local_38);
  }
  if (model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ON_FileStream::Close
              ((FILE *)model.super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
  }
  return fp._7_1_;
}

Assistant:

bool ONX_ModelTest::DumpReadWriteReadModel(const wchar_t* text_file_full_path) const
{
  bool rc = false;
  FILE* fp = nullptr;
  for (;;)
  {
    if (nullptr == text_file_full_path || 0 == text_file_full_path[0])
      break;
    fp = ON_FileStream::Open(text_file_full_path, L"w");
    if (nullptr == fp)
      break;
    const auto model = ReadWriteReadModel();
    if (nullptr == model)
      break;
    if (model->Manifest().ActiveComponentCount(ON_ModelComponent::Type::Unset) <= 0)
      break;
    ON_TextLog text_log(fp);
    rc = DumpReadWriteReadModel(text_log);
    break;
  }

  if (nullptr != fp)
    ON_FileStream::Close(fp);

  return rc;
}